

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.hpp
# Opt level: O0

void libtorrent::aux::
     random_shuffle<std::vector<libtorrent::aux::web_seed_t,std::allocator<libtorrent::aux::web_seed_t>>>
               (vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
                *range)

{
  web_seed_t *__first;
  web_seed_t *pwVar1;
  size_type sVar2;
  mt19937 *__g;
  vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> *range_local;
  
  __first = ::std::vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
            ::data(range);
  pwVar1 = ::std::vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
           ::data(range);
  sVar2 = ::std::vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::
          size(range);
  __g = random_engine();
  ::std::
  shuffle<libtorrent::aux::web_seed_t*,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            (__first,pwVar1 + sVar2,__g);
  return;
}

Assistant:

void random_shuffle(Range& range)
	{
#ifdef TORRENT_BUILD_SIMULATOR
		// in simulations, we want all shuffles to be deterministic (as long as
		// the random engine is deterministic
		if (range.size() == 0) return;
		for (auto i = range.size() - 1; i > 0; --i) {
			auto const other = random(std::uint32_t(i));
			if (i == other) continue;
			using std::swap;
			swap(range.data()[i], range.data()[other]);
		}
#else
		std::shuffle(range.data(), range.data() + range.size(), random_engine());
#endif
	}